

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O0

optional<unsigned_long> __thiscall graph_utils::Dsu<int>::Size(Dsu<int> *this,int *u)

{
  bool bVar1;
  int *__x;
  pointer ppVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  optional<unsigned_long> oVar4;
  _Rb_tree_iterator<std::pair<const_int,_unsigned_long>_> local_38;
  _Optional_payload_base<int> local_30;
  optional<int> u_rep;
  int *u_local;
  Dsu<int> *this_local;
  bool local_10;
  
  u_rep.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)u;
  local_30 = (_Optional_payload_base<int>)Find(this,u);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_30);
  if (bVar1) {
    __x = std::optional<int>::operator*((optional<int> *)&local_30);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
         ::find(&this->size_,__x);
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator->(&local_38);
    std::optional<unsigned_long>::optional<unsigned_long_&,_true>
              ((optional<unsigned_long> *)&this_local,&ppVar2->second);
    uVar3 = extraout_RDX;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&this_local);
    uVar3 = extraout_RDX_00;
  }
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)this_local
  ;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> Size(const Type& u) {
    if (auto u_rep = Find(u))
      return size_.find(*u_rep)->second;
    return {};
  }